

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotLineEx<ImPlot::GetterYs<signed_char>>(char *label_id,GetterYs<signed_char> *getter)

{
  double dVar1;
  ImVec2 IVar2;
  undefined8 uVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  ImPlotRange *pIVar17;
  ImPlotContext *pIVar18;
  undefined1 auVar19 [16];
  bool bVar20;
  ImU32 col;
  ImPlotContext *pIVar21;
  char *pcVar22;
  double dVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  float fVar31;
  float fVar32;
  char *pcVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined8 local_d8;
  ImU32 local_d0;
  ImU32 local_cc;
  ImDrawList *local_c8;
  uint local_bc;
  ulong local_b8;
  ulong local_b0;
  char *local_a8;
  long local_a0;
  ulong local_98;
  double local_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_5c;
  double local_58;
  undefined8 uStack_50;
  char *local_48;
  double dStack_40;
  
  bVar20 = BeginItem(label_id,0);
  pIVar21 = GImPlot;
  if (bVar20) {
    if ((GImPlot->FitThisFrame == true) && (iVar5 = getter->Count, 0 < iVar5)) {
      dVar1 = getter->X0;
      dVar23 = getter->XScale;
      pcVar33 = getter->Ys;
      iVar6 = getter->Offset;
      iVar25 = getter->Stride;
      pIVar10 = GImPlot->CurrentPlot;
      iVar7 = pIVar10->CurrentYAxis;
      uVar8 = (pIVar10->XAxis).Flags;
      pIVar17 = GImPlot->ExtentsY;
      uVar9 = pIVar10->YAxis[iVar7].Flags;
      iVar27 = 0;
      uVar24 = uVar9 & 0x20;
      uVar14 = uVar24 >> 5;
      local_88._0_4_ = uVar14;
      auVar19 = local_88;
      local_78 = (char *)(CONCAT44(local_78._4_4_,uVar8) & 0xffffffff00000020);
      dVar11 = 0.0;
      do {
        dVar36 = dVar23 * dVar11 + dVar1;
        cVar4 = pcVar33[(long)(((iVar6 + iVar27) % iVar5 + iVar5) % iVar5) * (long)iVar25];
        dVar13 = (double)(int)cVar4;
        if ((uVar8 >> 10 & 1) == 0) {
          if ((long)ABS(dVar36) < 0x7ff0000000000000) {
LAB_001bfbc8:
            if ((0.0 < dVar36) || ((int)local_78 == 0)) {
              dVar15 = (pIVar21->ExtentsX).Min;
              dVar16 = (pIVar21->ExtentsX).Max;
              uVar28 = -(ulong)(dVar36 < dVar15);
              uVar29 = -(ulong)(dVar16 < dVar36);
              auVar37._0_8_ = (ulong)dVar36 & uVar28;
              auVar37._8_8_ = (ulong)dVar36 & uVar29;
              auVar39._0_8_ = ~uVar28 & (ulong)dVar15;
              auVar39._8_8_ = ~uVar29 & (ulong)dVar16;
              pIVar21->ExtentsX = (ImPlotRange)(auVar39 | auVar37);
            }
          }
        }
        else if ((((long)ABS(dVar36) < 0x7ff0000000000000) &&
                 (pIVar10->YAxis[iVar7].Range.Min <= dVar13)) &&
                (dVar13 <= pIVar10->YAxis[iVar7].Range.Max)) goto LAB_001bfbc8;
        if ((uVar9 >> 10 & 1) == 0) {
          if (('\0' < cVar4) || (uVar24 == 0)) {
LAB_001bfc50:
            dVar36 = pIVar17[iVar7].Min;
            dVar15 = pIVar21->ExtentsY[iVar7].Max;
            uVar29 = -(ulong)(dVar13 < dVar36);
            uVar30 = -(ulong)(dVar15 < dVar13);
            uVar28 = (ulong)dVar13 & uVar30;
            auVar38._0_8_ = ~uVar29 & (ulong)dVar36;
            auVar38._8_8_ = ~uVar30 & (ulong)dVar15;
            auVar12._8_4_ = (int)uVar28;
            auVar12._0_8_ = (ulong)dVar13 & uVar29;
            auVar12._12_4_ = (int)(uVar28 >> 0x20);
            pIVar17[iVar7] = (ImPlotRange)(auVar38 | auVar12);
          }
        }
        else if ((((pIVar10->XAxis).Range.Min <= dVar36) && (dVar36 <= (pIVar10->XAxis).Range.Max))
                && (local_88[0] = (byte)uVar14, (cVar4 < '\x01' & local_88[0]) == 0))
        goto LAB_001bfc50;
        dVar11 = dVar11 + 1.0;
        iVar27 = iVar27 + 1;
        local_88 = auVar19;
      } while (iVar5 != iVar27);
    }
    local_c8 = GetPlotDrawList();
    if ((1 < getter->Count) && ((pIVar21->NextItemData).RenderLine == true)) {
      col = ImGui::GetColorU32((pIVar21->NextItemData).Colors);
      iVar5 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar5]) {
      case 0:
        local_d8 = CONCAT44(local_d8._4_4_,iVar5);
        RenderLineStrip<ImPlot::GetterYs<signed_char>,ImPlot::TransformerLinLin>
                  (getter,(TransformerLinLin *)&local_d8,local_c8,(pIVar21->NextItemData).LineWeight
                   ,col);
        break;
      case 1:
        local_d8 = CONCAT44(local_d8._4_4_,iVar5);
        RenderLineStrip<ImPlot::GetterYs<signed_char>,ImPlot::TransformerLogLin>
                  (getter,(TransformerLogLin *)&local_d8,local_c8,(pIVar21->NextItemData).LineWeight
                   ,col);
        break;
      case 2:
        local_d8 = CONCAT44(local_d8._4_4_,iVar5);
        RenderLineStrip<ImPlot::GetterYs<signed_char>,ImPlot::TransformerLinLog>
                  (getter,(TransformerLinLog *)&local_d8,local_c8,(pIVar21->NextItemData).LineWeight
                   ,col);
        break;
      case 3:
        local_d8 = CONCAT44(local_d8._4_4_,iVar5);
        RenderLineStrip<ImPlot::GetterYs<signed_char>,ImPlot::TransformerLogLog>
                  (getter,(TransformerLogLog *)&local_d8,local_c8,(pIVar21->NextItemData).LineWeight
                   ,col);
      }
    }
    if ((pIVar21->NextItemData).Marker != -1) {
      PopPlotClipRect();
      PushPlotClipRect((pIVar21->NextItemData).MarkerSize);
      local_cc = ImGui::GetColorU32((pIVar21->NextItemData).Colors + 2);
      local_d0 = ImGui::GetColorU32((pIVar21->NextItemData).Colors + 3);
      pIVar18 = GImPlot;
      transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
      lVar26 = (long)transformer.YAxis;
      switch(GImPlot->Scales[lVar26]) {
      case 0:
        iVar5 = getter->Count;
        if (0 < iVar5) {
          pcVar22 = getter->Ys;
          pcVar33 = (char *)getter->XScale;
          local_48 = (char *)getter->X0;
          uVar34 = SUB84(local_48,0);
          uVar35 = (undefined4)((ulong)local_48 >> 0x20);
          dVar23 = (double)(ulong)(uint)getter->Offset;
          local_90 = (double)CONCAT44(local_90._4_4_,(pIVar21->NextItemData).MarkerSize);
          local_98 = CONCAT44(local_98._4_4_,(pIVar21->NextItemData).MarkerWeight);
          local_a0 = (long)(pIVar21->NextItemData).Marker;
          iVar6 = getter->Stride;
          iVar25 = 0;
          dVar1 = 0.0;
          local_b0 = CONCAT44(local_b0._4_4_,(uint)(pIVar21->NextItemData).RenderMarkerLine);
          local_b8 = CONCAT44(local_b8._4_4_,(uint)(pIVar21->NextItemData).RenderMarkerFill);
          pIVar21 = GImPlot;
          local_a8 = pcVar22;
          local_78 = pcVar33;
          local_58 = dVar23;
          do {
            IVar2 = pIVar21->PixelRange[lVar26].Min;
            fVar31 = (float)(pIVar21->Mx *
                             (((double)pcVar33 * dVar1 + (double)CONCAT44(uVar35,uVar34)) -
                             (pIVar21->CurrentPlot->XAxis).Range.Min) + (double)IVar2.x);
            fVar32 = (float)(pIVar21->My[lVar26] *
                             ((double)(int)pcVar22[(long)(((SUB84(dVar23,0) + iVar25) % iVar5 +
                                                          iVar5) % iVar5) * (long)iVar6] -
                             pIVar21->CurrentPlot->YAxis[lVar26].Range.Min) + (double)IVar2.y);
            local_d8 = CONCAT44(fVar32,fVar31);
            pIVar10 = pIVar18->CurrentPlot;
            if ((((pIVar10->PlotRect).Min.x <= fVar31) && ((pIVar10->PlotRect).Min.y <= fVar32)) &&
               ((fVar31 < (pIVar10->PlotRect).Max.x && (fVar32 < (pIVar10->PlotRect).Max.y)))) {
              local_88._0_8_ = dVar1;
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<signed_char>>(ImPlot::GetterYs<signed>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_a0 * 8))
                        (local_90._0_4_,(undefined4)local_98,local_c8,&local_d8,
                         local_b0 & 0xffffffff,local_cc,local_b8 & 0xffffffff,local_d0);
              uVar34 = SUB84(local_48,0);
              uVar35 = (undefined4)((ulong)local_48 >> 0x20);
              pIVar21 = GImPlot;
              pcVar22 = local_a8;
              dVar23 = local_58;
              pcVar33 = local_78;
              dVar1 = (double)local_88._0_8_;
            }
            dVar1 = dVar1 + 1.0;
            iVar25 = iVar25 + 1;
          } while (iVar5 != iVar25);
        }
        break;
      case 1:
        iVar5 = getter->Count;
        if (0 < iVar5) {
          local_48 = getter->Ys;
          local_58 = getter->XScale;
          local_90 = getter->X0;
          local_98 = (ulong)(uint)getter->Offset;
          local_a8 = (char *)CONCAT44(local_a8._4_4_,(pIVar21->NextItemData).MarkerSize);
          local_b0 = CONCAT44(local_b0._4_4_,(pIVar21->NextItemData).MarkerWeight);
          local_b8 = (ulong)(pIVar21->NextItemData).Marker;
          iVar6 = getter->Stride;
          iVar25 = 0;
          dVar1 = 0.0;
          local_a0 = lVar26 << 4;
          local_bc = (uint)(pIVar21->NextItemData).RenderMarkerLine;
          local_5c = (uint)(pIVar21->NextItemData).RenderMarkerFill;
          do {
            pIVar21 = GImPlot;
            local_88._0_8_ = dVar1;
            local_78 = (char *)(double)(int)local_48[(long)((((int)local_98 + iVar25) % iVar5 +
                                                            iVar5) % iVar5) * (long)iVar6];
            uStack_70 = 0;
            dVar1 = log10((local_58 * dVar1 + local_90) / (GImPlot->CurrentPlot->XAxis).Range.Min);
            pIVar10 = pIVar21->CurrentPlot;
            dVar23 = (pIVar10->XAxis).Range.Min;
            uVar3 = *(undefined8 *)((long)&pIVar21->PixelRange[0].Min.x + local_a0);
            fVar31 = (float)(pIVar21->Mx *
                             (((double)(float)(dVar1 / pIVar21->LogDenX) *
                               ((pIVar10->XAxis).Range.Max - dVar23) + dVar23) - dVar23) +
                            (double)(float)uVar3);
            fVar32 = (float)(pIVar21->My[lVar26] *
                             ((double)local_78 - pIVar10->YAxis[lVar26].Range.Min) +
                            (double)(float)((ulong)uVar3 >> 0x20));
            local_d8 = CONCAT44(fVar32,fVar31);
            pIVar10 = pIVar18->CurrentPlot;
            if ((((pIVar10->PlotRect).Min.x <= fVar31) && ((pIVar10->PlotRect).Min.y <= fVar32)) &&
               ((fVar31 < (pIVar10->PlotRect).Max.x && (fVar32 < (pIVar10->PlotRect).Max.y)))) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<signed_char>>(ImPlot::GetterYs<signed>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_b8 * 8))
                        (local_a8._0_4_,(undefined4)local_b0,local_c8,&local_d8,local_bc,local_cc,
                         local_5c,local_d0);
            }
            dVar1 = (double)local_88._0_8_ + 1.0;
            iVar25 = iVar25 + 1;
          } while (iVar5 != iVar25);
        }
        break;
      case 2:
        iVar5 = getter->Count;
        if (0 < iVar5) {
          local_78 = getter->Ys;
          local_48 = (char *)getter->XScale;
          dStack_40 = getter->X0;
          local_58 = getter->X0;
          uStack_50._0_4_ = getter->Offset;
          uStack_50._4_4_ = getter->Stride;
          local_90 = (double)(ulong)(uint)getter->Offset;
          local_a0 = CONCAT44(local_a0._4_4_,(pIVar21->NextItemData).MarkerSize);
          local_a8 = (char *)CONCAT44(local_a8._4_4_,(pIVar21->NextItemData).MarkerWeight);
          local_b0 = (ulong)(pIVar21->NextItemData).Marker;
          iVar6 = getter->Stride;
          iVar25 = 0;
          dVar1 = 0.0;
          local_88._8_4_ = 0;
          local_88._12_4_ = 0;
          local_98 = lVar26 << 4;
          local_b8 = CONCAT44(local_b8._4_4_,(uint)(pIVar21->NextItemData).RenderMarkerLine);
          local_bc = (uint)(pIVar21->NextItemData).RenderMarkerFill;
          do {
            pIVar21 = GImPlot;
            local_88._0_8_ = dVar1;
            dVar23 = log10((double)(int)local_78[(long)(((SUB84(local_90,0) + iVar25) % iVar5 +
                                                        iVar5) % iVar5) * (long)iVar6] /
                           GImPlot->CurrentPlot->YAxis[lVar26].Range.Min);
            pIVar10 = pIVar21->CurrentPlot;
            dVar1 = pIVar10->YAxis[lVar26].Range.Min;
            uVar3 = *(undefined8 *)((long)&pIVar21->PixelRange[0].Min.x + local_98);
            fVar31 = (float)(pIVar21->Mx *
                             ((local_58 + local_88._0_8_ * (double)local_48) -
                             (pIVar10->XAxis).Range.Min) + (double)(float)uVar3);
            fVar32 = (float)(pIVar21->My[lVar26] *
                             ((dVar1 + (double)(float)(dVar23 / pIVar21->LogDenY[lVar26]) *
                                       (pIVar10->YAxis[lVar26].Range.Max - dVar1)) - dVar1) +
                            (double)(float)((ulong)uVar3 >> 0x20));
            local_d8 = CONCAT44(fVar32,fVar31);
            pIVar10 = pIVar18->CurrentPlot;
            if (((((pIVar10->PlotRect).Min.x <= fVar31) &&
                 (uVar3 = *(undefined8 *)&(pIVar10->PlotRect).Min.y, (float)uVar3 <= fVar32)) &&
                (fVar31 < (float)((ulong)uVar3 >> 0x20))) && (fVar32 < (pIVar10->PlotRect).Max.y)) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<signed_char>>(ImPlot::GetterYs<signed>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_b0 * 8))
                        ((undefined4)local_a0,local_a8._0_4_,local_c8,&local_d8,
                         local_b8 & 0xffffffff,local_cc,local_bc,local_d0);
            }
            dVar1 = (double)CONCAT44(local_88._4_4_,local_88._0_4_) + 1.0;
            iVar25 = iVar25 + 1;
          } while (iVar5 != iVar25);
        }
        break;
      case 3:
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<signed_char>>
                  (*getter,transformer,local_c8,(pIVar21->NextItemData).Marker,
                   (pIVar21->NextItemData).MarkerSize,(pIVar21->NextItemData).RenderMarkerLine,
                   local_cc,(pIVar21->NextItemData).MarkerWeight,
                   (pIVar21->NextItemData).RenderMarkerFill,local_d0);
      }
    }
    pIVar21 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar21->NextItemData);
    pIVar21->PreviousItem = pIVar21->CurrentItem;
    pIVar21->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotLineEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        if (getter.Count > 1 && s.RenderLine) {
            const ImU32 col_line    = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineStrip(getter, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineStrip(getter, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineStrip(getter, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineStrip(getter, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        if (s.Marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}